

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitio.cpp
# Opt level: O0

ssize_t __thiscall bitio::bitio_stream::write(bitio_stream *this,int __fd,void *__buf,size_t __n)

{
  uint64_t uVar1;
  void *pvVar2;
  byte bVar3;
  undefined4 in_register_00000034;
  byte local_29;
  void *pvStack_28;
  uchar mask_index;
  uint64_t i;
  uint64_t n_local;
  uint64_t obj_local;
  bitio_stream *this_local;
  
  pvStack_28 = (void *)0x0;
  local_29 = 0;
  while( true ) {
    pvVar2 = (void *)((long)pvStack_28 + 1);
    if (__buf <= pvStack_28) break;
    this->bit_buffer = this->bit_buffer << 1;
    bVar3 = local_29 + 1;
    this->bit_buffer =
         this->bit_buffer +
         ((CONCAT44(in_register_00000034,__fd) << (0x40U - (char)__buf & 0x3f) &
          *(ulong *)(ui64_single_bit_masks + (long)(int)(0x3f - (uint)local_29) * 8)) != 0);
    this->bit_count = this->bit_count + '\x01';
    local_29 = bVar3;
    pvStack_28 = pvVar2;
    if (this->bit_count == '\b') {
      uVar1 = this->byte_index;
      this->byte_index = uVar1 + 1;
      this->byte_buffer[uVar1] = this->bit_buffer;
      if (this->byte_index == this->buffer_size) {
        wflush(this);
        this->byte_index = 0;
      }
      this->bit_buffer = '\0';
      this->bit_count = '\0';
    }
  }
  return (ssize_t)pvStack_28;
}

Assistant:

void bitio_stream::write(uint64_t obj, uint64_t n) {
    uint64_t i = 0;
    obj <<= 0x40 - n;

    unsigned char mask_index = 0;
    while (i++ < n) {
        bit_buffer <<= 1;
        bit_buffer += (obj & ui64_single_bit_masks[0x3f - mask_index++]) != 0;;
        bit_count++;
        if (bit_count == 8) {
            byte_buffer[byte_index++] = bit_buffer;
            if (byte_index == buffer_size) {
                wflush();
                byte_index = 0;
            }
            bit_buffer = 0;
            bit_count = 0;
        }

    }
}